

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

DataPageHeaderV2 * __thiscall
duckdb_parquet::DataPageHeaderV2::operator=(DataPageHeaderV2 *this,DataPageHeaderV2 *other71)

{
  int32_t iVar1;
  int32_t iVar2;
  type tVar3;
  
  iVar1 = other71->num_nulls;
  iVar2 = other71->num_rows;
  tVar3 = other71->encoding;
  this->num_values = other71->num_values;
  this->num_nulls = iVar1;
  this->num_rows = iVar2;
  this->encoding = tVar3;
  iVar1 = other71->repetition_levels_byte_length;
  this->definition_levels_byte_length = other71->definition_levels_byte_length;
  this->repetition_levels_byte_length = iVar1;
  this->is_compressed = other71->is_compressed;
  Statistics::operator=(&this->statistics,&other71->statistics);
  this->__isset = other71->__isset;
  return this;
}

Assistant:

DataPageHeaderV2& DataPageHeaderV2::operator=(const DataPageHeaderV2& other71) {
  num_values = other71.num_values;
  num_nulls = other71.num_nulls;
  num_rows = other71.num_rows;
  encoding = other71.encoding;
  definition_levels_byte_length = other71.definition_levels_byte_length;
  repetition_levels_byte_length = other71.repetition_levels_byte_length;
  is_compressed = other71.is_compressed;
  statistics = other71.statistics;
  __isset = other71.__isset;
  return *this;
}